

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O3

void __thiscall
Assimp::ScenePreprocessor::ProcessAnimation(ScenePreprocessor *this,aiAnimation *anim)

{
  aiNodeAnim *paVar1;
  aiNode *paVar2;
  aiQuatKey *paVar3;
  Logger *pLVar4;
  aiVectorKey *paVar5;
  long lVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  aiQuaterniont<float> local_48;
  
  if (anim->mNumChannels == 0) {
    dVar12 = 100000000000.0;
    dVar10 = -100000000000.0;
  }
  else {
    dVar10 = -100000000000.0;
    dVar12 = 100000000000.0;
    uVar7 = 0;
    do {
      paVar1 = anim->mChannels[uVar7];
      if ((anim->mDuration != -1.0) || (NAN(anim->mDuration))) {
        if (paVar1->mNumRotationKeys != 0) goto LAB_0013ac00;
LAB_0013ac24:
        paVar2 = aiNode::FindNode(this->scene->mRootNode,(paVar1->mNodeName).data);
        if (paVar2 != (aiNode *)0x0) {
          local_58.x = 0.0;
          local_58.y = 0.0;
          local_58.z = 0.0;
          local_68.x = 0.0;
          local_68.y = 0.0;
          local_68.z = 0.0;
          local_48.w = 1.0;
          local_48.x = 0.0;
          local_48.y = 0.0;
          local_48.z = 0.0;
          aiMatrix4x4t<float>::Decompose(&paVar2->mTransformation,&local_58,&local_48,&local_68);
          if (paVar1->mNumRotationKeys == 0) {
            paVar1->mNumRotationKeys = 1;
            paVar3 = (aiQuatKey *)operator_new__(0x18);
            paVar1->mRotationKeys = paVar3;
            paVar3->mTime = 0.0;
            (paVar3->mValue).w = local_48.w;
            (paVar3->mValue).x = local_48.x;
            (paVar3->mValue).y = local_48.y;
            (paVar3->mValue).z = local_48.z;
            pLVar4 = DefaultLogger::get();
            Logger::debug(pLVar4,"ScenePreprocessor: Dummy rotation track has been generated");
          }
          if (paVar1->mNumScalingKeys == 0) {
            paVar1->mNumScalingKeys = 1;
            paVar5 = (aiVectorKey *)operator_new__(0x18);
            paVar1->mScalingKeys = paVar5;
            paVar5->mTime = 0.0;
            (paVar5->mValue).x = local_58.x;
            (paVar5->mValue).y = local_58.y;
            (paVar5->mValue).z = local_58.z;
            pLVar4 = DefaultLogger::get();
            Logger::debug(pLVar4,"ScenePreprocessor: Dummy scaling track has been generated");
          }
          if (paVar1->mNumPositionKeys == 0) {
            paVar1->mNumPositionKeys = 1;
            paVar5 = (aiVectorKey *)operator_new__(0x18);
            paVar1->mPositionKeys = paVar5;
            paVar5->mTime = 0.0;
            (paVar5->mValue).x = local_68.x;
            (paVar5->mValue).y = local_68.y;
            (paVar5->mValue).z = local_68.z;
            pLVar4 = DefaultLogger::get();
            Logger::debug(pLVar4,"ScenePreprocessor: Dummy position track has been generated");
          }
        }
      }
      else {
        if ((ulong)paVar1->mNumPositionKeys == 0) {
          uVar8 = SUB84(dVar10,0);
          uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
        }
        else {
          lVar6 = 0;
          dVar11 = dVar12;
          do {
            dVar13 = *(double *)((long)&paVar1->mPositionKeys->mTime + lVar6);
            uVar8 = SUB84(dVar13,0);
            uVar9 = (undefined4)((ulong)dVar13 >> 0x20);
            dVar12 = dVar13;
            if (dVar11 <= dVar13) {
              dVar12 = dVar11;
            }
            if (dVar13 <= dVar10) {
              uVar8 = SUB84(dVar10,0);
              uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
            }
            lVar6 = lVar6 + 0x18;
            dVar10 = (double)CONCAT44(uVar9,uVar8);
            dVar11 = dVar12;
          } while ((ulong)paVar1->mNumPositionKeys * 0x18 != lVar6);
        }
        if ((ulong)paVar1->mNumScalingKeys == 0) {
          dVar10 = (double)CONCAT44(uVar9,uVar8);
        }
        else {
          lVar6 = 0;
          do {
            dVar10 = *(double *)((long)&paVar1->mScalingKeys->mTime + lVar6);
            dVar11 = dVar10;
            if (dVar12 <= dVar10) {
              dVar11 = dVar12;
            }
            dVar12 = dVar11;
            if (dVar10 <= (double)CONCAT44(uVar9,uVar8)) {
              dVar10 = (double)CONCAT44(uVar9,uVar8);
            }
            lVar6 = lVar6 + 0x18;
            uVar8 = SUB84(dVar10,0);
            uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
          } while ((ulong)paVar1->mNumScalingKeys * 0x18 != lVar6);
        }
        if ((ulong)paVar1->mNumRotationKeys == 0) goto LAB_0013ac24;
        lVar6 = 0;
        dVar11 = dVar10;
        dVar13 = dVar12;
        do {
          dVar10 = *(double *)((long)&paVar1->mRotationKeys->mTime + lVar6);
          dVar12 = dVar10;
          if (dVar13 <= dVar10) {
            dVar12 = dVar13;
          }
          if (dVar10 <= dVar11) {
            dVar10 = dVar11;
          }
          lVar6 = lVar6 + 0x18;
          dVar11 = dVar10;
          dVar13 = dVar12;
        } while ((ulong)paVar1->mNumRotationKeys * 0x18 != lVar6);
LAB_0013ac00:
        if ((paVar1->mNumPositionKeys == 0) || (paVar1->mNumScalingKeys == 0)) goto LAB_0013ac24;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < anim->mNumChannels);
  }
  if ((anim->mDuration == -1.0) && (!NAN(anim->mDuration))) {
    pLVar4 = DefaultLogger::get();
    Logger::debug(pLVar4,"ScenePreprocessor: Setting animation duration");
    uVar8 = 0;
    uVar9 = 0;
    if (dVar12 <= 0.0) {
      uVar8 = SUB84(dVar12,0);
      uVar9 = (undefined4)((ulong)dVar12 >> 0x20);
    }
    anim->mDuration = dVar10 - (double)CONCAT44(uVar9,uVar8);
  }
  return;
}

Assistant:

void ScenePreprocessor::ProcessAnimation (aiAnimation* anim)
{
    double first = 10e10, last = -10e10;
    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* channel = anim->mChannels[i];

        /*  If the exact duration of the animation is not given
         *  compute it now.
         */
        if (anim->mDuration == -1.) {

            // Position keys
            for (unsigned int j = 0; j < channel->mNumPositionKeys;++j) {
                aiVectorKey& key = channel->mPositionKeys[j];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }

            // Scaling keys
            for (unsigned int j = 0; j < channel->mNumScalingKeys;++j )  {
                aiVectorKey& key = channel->mScalingKeys[j];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }

            // Rotation keys
            for (unsigned int j = 0; j < channel->mNumRotationKeys;++j ) {
                aiQuatKey& key = channel->mRotationKeys[ j ];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }
        }

        /*  Check whether the animation channel has no rotation
         *  or position tracks. In this case we generate a dummy
         *  track from the information we have in the transformation
         *  matrix of the corresponding node.
         */
        if (!channel->mNumRotationKeys || !channel->mNumPositionKeys || !channel->mNumScalingKeys)  {
            // Find the node that belongs to this animation
            aiNode* node = scene->mRootNode->FindNode(channel->mNodeName);
            if (node) // ValidateDS will complain later if 'node' is NULL
            {
                // Decompose the transformation matrix of the node
                aiVector3D scaling, position;
                aiQuaternion rotation;

                node->mTransformation.Decompose(scaling, rotation,position);

                // No rotation keys? Generate a dummy track
                if (!channel->mNumRotationKeys) {
                    channel->mNumRotationKeys = 1;
                    channel->mRotationKeys = new aiQuatKey[1];
                    aiQuatKey& q = channel->mRotationKeys[0];

                    q.mTime  = 0.;
                    q.mValue = rotation;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy rotation track has been generated");
                }

                // No scaling keys? Generate a dummy track
                if (!channel->mNumScalingKeys)  {
                    channel->mNumScalingKeys = 1;
                    channel->mScalingKeys = new aiVectorKey[1];
                    aiVectorKey& q = channel->mScalingKeys[0];

                    q.mTime  = 0.;
                    q.mValue = scaling;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy scaling track has been generated");
                }

                // No position keys? Generate a dummy track
                if (!channel->mNumPositionKeys) {
                    channel->mNumPositionKeys = 1;
                    channel->mPositionKeys = new aiVectorKey[1];
                    aiVectorKey& q = channel->mPositionKeys[0];

                    q.mTime  = 0.;
                    q.mValue = position;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy position track has been generated");
                }
            }
        }
    }

    if (anim->mDuration == -1.)     {
        ASSIMP_LOG_DEBUG("ScenePreprocessor: Setting animation duration");
        anim->mDuration = last - std::min( first, 0. );
    }
}